

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O1

void __thiscall icu_63::Package::readPackage(Package *this,char *filename)

{
  undefined1 *puVar1;
  UErrorCode UVar2;
  UErrorCode UVar3;
  UErrorCode UVar4;
  Item *pIVar5;
  uint8_t *data;
  UBool *pUVar6;
  undefined8 uVar7;
  uint8_t inCharset;
  char cVar8;
  int32_t iVar9;
  uint32_t uVar10;
  int iVar11;
  UErrorCode UVar12;
  uint8_t *puVar13;
  UDataSwapper *pUVar14;
  char *pcVar15;
  char *pcVar16;
  size_t sVar17;
  FILE *__stream;
  undefined8 extraout_RAX;
  byte bVar18;
  uint uVar19;
  UDataSwapper *pUVar20;
  int32_t in_EDX;
  uint *extraout_RDX;
  uint uVar21;
  Package *this_00;
  long lVar22;
  UErrorCode UVar24;
  Package *pPVar23;
  char *path;
  UDataSwapper *__n;
  UDataSwapper *pUVar25;
  UBool *__s1;
  int iVar26;
  size_t __n_00;
  long lVar27;
  UDataSwapper *__n_01;
  UErrorCode errorCode;
  char type;
  char prefix [68];
  UErrorCode UStack_53c;
  char acStack_538 [1032];
  Package *pPStack_130;
  size_t sStack_128;
  UDataSwapper *pUStack_120;
  char *pcStack_118;
  UDataSwapper *pUStack_110;
  Package *pPStack_108;
  Package *pPStack_f8;
  UDataSwapper *pUStack_f0;
  UDataSwapper *pUStack_e8;
  UDataSwapper *pUStack_e0;
  undefined1 local_d4 [12];
  UDataSwapper *local_c8;
  byte local_b9;
  uint local_b8;
  uint local_b4;
  char *local_b0;
  UDataSwapper *local_a8;
  Package *local_a0;
  uint8_t *local_98;
  UDataSwapper *local_90;
  UDataSwapper *local_88;
  undefined1 *local_80;
  char local_78 [72];
  
  pUStack_e0 = (UDataSwapper *)0x1e6fa4;
  extractPackageName(filename,this->inPkgName,in_EDX);
  uVar21 = 0;
  pUStack_e0 = (UDataSwapper *)0x1e6fc4;
  local_b0 = filename;
  puVar13 = readFile((char *)0x0,filename,&this->inLength,(char *)&local_b9);
  this->inData = puVar13;
  iVar26 = this->inLength;
  local_d4._0_4_ = U_ZERO_ERROR;
  __n = (UDataSwapper *)(ulong)local_b9;
  if (local_b9 == 0x62) {
    uVar21 = 1;
  }
  else if (local_b9 != 0x6c) {
    uVar21 = (uint)(local_b9 == 0x65) * 4 - 1;
  }
  inCharset = (uint8_t)(uVar21 >> 1);
  this->inCharset = inCharset;
  this->inIsBigEndian = (byte)uVar21 & 1;
  pUStack_e0 = (UDataSwapper *)0x1e702f;
  pUVar14 = udata_openSwapper_63((byte)uVar21 & 1,inCharset,'\0','\0',(UErrorCode *)local_d4);
  UVar24 = local_d4._0_4_;
  if (U_ZERO_ERROR < (int)local_d4._0_4_) {
LAB_001e7528:
    pUStack_e0 = (UDataSwapper *)0x1e7537;
    readPackage();
LAB_001e7537:
    pUStack_e0 = (UDataSwapper *)0x1e753c;
    exit(UVar24);
  }
  pUVar14->printError = printPackageError;
  iVar9 = 0x400;
  if (iVar26 < 0x400) {
    iVar9 = iVar26;
  }
  pUVar14->printErrorContext = _stderr;
  this->headerLength = iVar9;
  pUStack_e0 = (UDataSwapper *)0x1e7089;
  iVar9 = udata_swapDataHeader_63(pUVar14,this->inData,iVar9,this->header,(UErrorCode *)local_d4);
  this->headerLength = iVar9;
  UVar24 = local_d4._0_4_;
  if (U_ZERO_ERROR < (int)local_d4._0_4_) goto LAB_001e7537;
  puVar13 = this->inData;
  bVar18 = puVar13[0xc];
  local_d4._4_8_ = pUVar14;
  if ((((bVar18 != 0x43) || (puVar13[0xd] != 'm')) || (puVar13[0xe] != 'n')) ||
     ((puVar13[0xf] != 'D' || (puVar13[0x10] != '\x01')))) {
LAB_001e7520:
    UVar24 = (UErrorCode)bVar18;
    pUStack_e0 = (UDataSwapper *)0x1e7528;
    readPackage();
    goto LAB_001e7528;
  }
  this->inIsBigEndian = puVar13[8];
  this->inCharset = puVar13[9];
  pUVar25 = (UDataSwapper *)(long)iVar9;
  __n_01 = (UDataSwapper *)(puVar13 + (long)pUVar25);
  pUVar20 = (UDataSwapper *)(puVar13 + (long)pUVar25 + 4);
  uVar21 = iVar26 - iVar9;
  this_00 = (Package *)0x7fffffff;
  local_a8 = pUVar20;
  local_98 = puVar13;
  if (3 < (int)uVar21) {
    UVar24._0_1_ = __n_01->inIsBigEndian;
    UVar24._1_1_ = __n_01->inCharset;
    UVar24._2_1_ = __n_01->outIsBigEndian;
    UVar24._3_1_ = __n_01->outCharset;
    pUStack_e0 = (UDataSwapper *)0x1e711f;
    iVar9 = udata_readInt32_63(pUVar14,UVar24);
    this->itemCount = iVar9;
    pUStack_e0 = (UDataSwapper *)0x1e712f;
    setItemCapacity(this,iVar9);
    iVar26 = this->itemCount;
    if ((long)iVar26 == 0) {
      this_00 = (Package *)0x4;
    }
    else {
      uVar19 = iVar26 * 8 + 4;
      pUVar20 = (UDataSwapper *)(ulong)uVar19;
      if ((int)uVar19 <= (int)uVar21) {
        pUStack_e0 = (UDataSwapper *)0x1e7158;
        pUVar20 = local_a8;
        uVar10 = (**(UDataReadUInt32 **)(local_d4._4_8_ + 0x10))
                           (*(uint32_t *)((long)local_a8 + (long)iVar26 * 8 + -4));
        this_00 = (Package *)(ulong)(uVar10 + 0x14);
      }
    }
  }
  local_b8 = uVar21;
  if ((int)uVar21 < (int)this_00) {
    pPVar23 = (Package *)(ulong)uVar21;
    pUStack_e0 = (UDataSwapper *)0x1e7545;
    readPackage(pPVar23);
LAB_001e7545:
    pUVar14 = (UDataSwapper *)(ulong)uVar21;
    pUStack_e0 = (UDataSwapper *)0x1e754a;
    readPackage(pPVar23);
LAB_001e754a:
    pUStack_e0 = (UDataSwapper *)0x1e754f;
    readPackage();
LAB_001e754f:
    pUStack_e0 = (UDataSwapper *)0x1e7554;
    readPackage();
LAB_001e7554:
    pUStack_e0 = (UDataSwapper *)0x1e7566;
    readPackage();
LAB_001e7566:
    pUStack_e0 = (UDataSwapper *)0x1e756e;
    readPackage(this_00);
LAB_001e756e:
    pUStack_e0 = (UDataSwapper *)0x1e7576;
    readPackage(this_00);
  }
  else {
    uVar21 = this->itemCount;
    if ((int)uVar21 < 1) {
      pUVar14 = (UDataSwapper *)local_d4._4_8_;
      if (this->doAutoPrefix == '\0') goto LAB_001e74e6;
      pUStack_e0 = (UDataSwapper *)0x1e730a;
      readPackage();
LAB_001e730a:
      pUStack_e0 = (UDataSwapper *)0x1e7312;
      sVar17 = strlen(this->inPkgName);
      iVar26 = (int)sVar17;
      __n_00 = (size_t)iVar26;
      pUStack_e0 = (UDataSwapper *)0x1e7325;
      memcpy(local_78,this,__n_00);
      pUStack_e0 = (UDataSwapper *)0x1e732d;
      sVar17 = strlen(this_00->inPkgName);
      __n_01 = local_c8;
      pUVar20 = (UDataSwapper *)(ulong)(iVar26 + 2U);
      if ((int)sVar17 < (int)(iVar26 + 2U)) {
LAB_001e7355:
        cVar8 = '/';
      }
      else {
        pUStack_e0 = (UDataSwapper *)0x1e7348;
        iVar11 = bcmp(this_00,this,__n_00);
        if ((iVar11 != 0) || (cVar8 = '_', this_00->inPkgName[__n_00] != 0x5f)) goto LAB_001e7355;
      }
      local_78[__n_00] = cVar8;
      iVar26 = iVar26 + 1;
LAB_001e735f:
      puVar13 = local_98;
      local_c8 = (UDataSwapper *)&this->itemCount;
      this_00 = (Package *)&this->items;
      __n = (UDataSwapper *)(long)iVar26;
      local_78[(long)__n] = '\0';
      UVar12 = *(UErrorCode *)local_c8;
      if (U_ZERO_ERROR < UVar12) {
        pUVar6 = &__n_01->inIsBigEndian;
        __n_01 = (UDataSwapper *)(local_98 + (long)(pUVar6 + 8));
        lVar22 = 0;
        lVar27 = 0;
        pUVar14 = (UDataSwapper *)local_d4._4_8_;
        local_a0 = this;
        local_90 = pUVar25;
        do {
          pUStack_e0 = (UDataSwapper *)0x1e73ae;
          uVar10 = (*pUVar14->readUInt32)(*(uint32_t *)(puVar13 + (long)(pUVar6 + lVar27 * 8 + 4)));
          __s1 = &local_90->inIsBigEndian + (int)(uVar10 - (int)local_80);
          pUStack_e0 = (UDataSwapper *)0x1e73ca;
          iVar26 = strncmp(__s1,local_78,(size_t)__n);
          pUVar25 = (UDataSwapper *)local_d4._4_8_;
          bVar18 = (byte)pUVar20;
          if ((iVar26 != 0) || (__s1[(long)__n] == 0)) {
            pUStack_e0 = (UDataSwapper *)0x1e750d;
            readPackage();
LAB_001e750d:
            pUStack_e0 = (UDataSwapper *)0x1e7520;
            readPackage();
            goto LAB_001e7520;
          }
          *(UBool **)((long)&(*(Item **)this_00)->name + lVar22) = __s1 + (long)__n;
          pUStack_e0 = (UDataSwapper *)0x1e73f5;
          uVar10 = (**(UDataReadUInt32 **)(local_d4._4_8_ + 0x10))
                             (*(uint32_t *)(&__n_01->inIsBigEndian + lVar27 * 8));
          bVar18 = (byte)pUVar20;
          pIVar5 = *(Item **)this_00;
          *(UBool **)((long)&pIVar5->data + lVar22) = &local_88->inIsBigEndian + uVar10;
          if (lVar22 != 0) {
            data = *(uint8_t **)((long)pIVar5 + lVar22 + -0x10);
            iVar26 = (int)(&local_88->inIsBigEndian + uVar10) - (int)data;
            *(int *)((long)pIVar5 + lVar22 + -8) = iVar26;
            pUStack_e0 = (UDataSwapper *)0x1e741e;
            uVar21 = getTypeEnumForInputData(data,iVar26,(UErrorCode *)local_d4);
            if (((int)uVar21 < 0) || (U_ZERO_ERROR < (int)local_d4._0_4_)) goto LAB_001e750d;
            pUVar20 = *(UDataSwapper **)this_00;
            *(char *)((long)pUVar20 + lVar22 + -3) = "lb?e"[uVar21];
          }
          (&(*(Item **)this_00)->isDataOwned)[lVar22] = '\0';
          lVar27 = lVar27 + 1;
          UVar12._0_1_ = local_c8->inIsBigEndian;
          UVar12._1_1_ = local_c8->inCharset;
          UVar12._2_1_ = local_c8->outIsBigEndian;
          UVar12._3_1_ = local_c8->outCharset;
          lVar22 = lVar22 + 0x18;
          this = local_a0;
          pUVar14 = pUVar25;
        } while (lVar27 < UVar12);
      }
      pUVar14 = (UDataSwapper *)local_d4._4_8_;
      pUStack_e0 = (UDataSwapper *)0x1e747d;
      uVar10 = (**(UDataReadUInt32 **)(local_d4._4_8_ + 0x10))
                         (*(uint32_t *)((long)local_a8 + (long)UVar12 * 8 + -4));
      pIVar5 = *(Item **)this_00;
      UVar3._0_1_ = local_c8->inIsBigEndian;
      UVar3._1_1_ = local_c8->inCharset;
      UVar3._2_1_ = local_c8->outIsBigEndian;
      UVar3._3_1_ = local_c8->outCharset;
      lVar22 = (long)UVar3;
      pUVar20 = (UDataSwapper *)(lVar22 * 3);
      pIVar5[lVar22 + -1].length = local_b8 - uVar10;
      pUStack_e0 = (UDataSwapper *)0x1e74a5;
      uVar21 = getTypeEnumForInputData
                         (pIVar5[lVar22 + -1].data,local_b8 - uVar10,(UErrorCode *)local_d4);
      if ((-1 < (int)uVar21) && ((int)local_d4._0_4_ < U_ILLEGAL_ARGUMENT_ERROR)) {
        UVar4._0_1_ = local_c8->inIsBigEndian;
        UVar4._1_1_ = local_c8->inCharset;
        UVar4._2_1_ = local_c8->outIsBigEndian;
        UVar4._3_1_ = local_c8->outCharset;
        (*(Item **)this_00)[(long)UVar4 + -1].type = "lb?e"[uVar21];
        if ((char)local_b4 != 'l') {
          pUStack_e0 = (UDataSwapper *)0x1e74e6;
          sortItems(this);
        }
LAB_001e74e6:
        pUStack_e0 = (UDataSwapper *)0x1e74ee;
        udata_closeSwapper_63(pUVar14);
        return;
      }
      goto LAB_001e7554;
    }
    pPVar23 = (Package *)(ulong)(uint)this->itemMax;
    if (this->itemMax < (int)uVar21) goto LAB_001e7545;
    pUVar14 = (UDataSwapper *)(ulong)(uVar21 * 8);
    puVar1 = &pUVar14->field_0x4;
    pUStack_e0 = (UDataSwapper *)0x1e71a5;
    uVar10 = (**(UDataReadUInt32 **)(local_d4._4_8_ + 0x10))(*(uint32_t *)&__n_01->readUInt16);
    uVar7 = local_d4._4_8_;
    iVar26 = (int)puVar1;
    uVar19 = uVar10 - iVar26;
    this_00 = (Package *)(ulong)uVar19;
    if (uVar19 != 0 && iVar26 <= (int)uVar10) {
      this_00 = (Package *)(ulong)uVar19;
      iVar11 = uVar10 + uVar21 * -8 + -3;
      do {
        if (((undefined1 *)((long)&__n_01[-1].printErrorContext + 7) + (long)puVar1)[(long)this_00]
            == '\0') goto LAB_001e71cf;
        this_00 = (Package *)&this_00[-1].field_0x31217;
        iVar11 = iVar11 + -1;
      } while (1 < iVar11);
      this_00 = (Package *)0x0;
    }
LAB_001e71cf:
    local_b4 = (uint)local_b9;
    iVar11 = (int)this_00;
    uVar21 = this->inStringTop + iVar11;
    pUVar20 = (UDataSwapper *)(ulong)uVar21;
    local_c8 = pUVar25;
    if (100000 < (int)uVar21) goto LAB_001e754a;
    __n = (UDataSwapper *)(this->inStrings + this->inStringTop);
    pUVar14 = (UDataSwapper *)local_d4;
    pUStack_e0 = (UDataSwapper *)0x1e7220;
    pUVar20 = __n;
    local_88 = __n_01;
    (**(UDataSwapFn **)(local_d4._4_8_ + 0x48))
              ((UDataSwapper *)local_d4._4_8_,&__n_01->inIsBigEndian + ((ulong)puVar1 & 0xffffffff),
               iVar11,__n,(UErrorCode *)pUVar14);
    pUVar25 = (UDataSwapper *)puVar1;
    __n_01 = (UDataSwapper *)uVar7;
    if (U_ZERO_ERROR < (int)local_d4._0_4_) goto LAB_001e754f;
    this->inStringTop = this->inStringTop + iVar11;
    pUStack_e0 = (UDataSwapper *)0x1e724d;
    memset(this->items,0,(long)this->itemCount * 0x18);
    UVar2._0_1_ = local_a8->inIsBigEndian;
    UVar2._1_1_ = local_a8->inCharset;
    UVar2._2_1_ = local_a8->outIsBigEndian;
    UVar2._3_1_ = local_a8->outCharset;
    pUStack_e0 = (UDataSwapper *)0x1e7258;
    uVar10 = (**(UDataReadUInt32 **)(uVar7 + 0x10))(UVar2);
    this_00 = (Package *)(&__n->inIsBigEndian + (int)(uVar10 - iVar26));
    pUVar25 = __n;
    local_80 = puVar1;
    if (this->doAutoPrefix == '\0') goto LAB_001e730a;
    pUStack_e0 = (UDataSwapper *)0x1e7283;
    pcVar15 = strchr((char *)this_00,0x2f);
    __n_01 = local_c8;
    pUVar20 = (UDataSwapper *)(ulong)local_b4;
    if (pcVar15 == (char *)0x0) goto LAB_001e7566;
    pUVar14 = (UDataSwapper *)(pcVar15 + -(long)this_00);
    iVar26 = (int)pUVar14;
    if ((iVar26 == 0) || (0x3f < iVar26)) goto LAB_001e756e;
    if ((this->prefixEndsWithType == '\0') || (this_00->inPkgName[iVar26 + -1] == (byte)local_b4)) {
      pUStack_e0 = (UDataSwapper *)0x1e72d8;
      memcpy(this->pkgPrefix,this_00,(long)iVar26);
      this->pkgPrefix[iVar26] = '\0';
      iVar26 = iVar26 + 1;
      pUStack_e0 = (UDataSwapper *)0x1e72f1;
      memcpy(local_78,this_00,(long)iVar26);
      goto LAB_001e735f;
    }
  }
  pcVar16 = (char *)((ulong)pUVar20 & 0xff);
  pUStack_e0 = (UDataSwapper *)extractPackageName;
  pPVar23 = this_00;
  readPackage();
  pPStack_108 = (Package *)0x1e7591;
  pcVar15 = pPVar23->inPkgName;
  pPStack_f8 = this_00;
  pUStack_f0 = __n;
  pUStack_e8 = pUVar14;
  pUStack_e0 = __n_01;
  pcVar16 = findBasename(pcVar16);
  pPStack_108 = (Package *)0x1e759c;
  sVar17 = strlen(pcVar16);
  iVar26 = (int)sVar17;
  if (iVar26 < 5) {
LAB_001e75e7:
    pPStack_108 = (Package *)0x1e75ef;
    extractPackageName();
  }
  else {
    __n_01 = (UDataSwapper *)(ulong)(iVar26 - 4);
    pcVar15 = ".dat";
    pPStack_108 = (Package *)0x1e75be;
    iVar11 = strcmp(pcVar16 + (long)__n_01,".dat");
    if (iVar11 != 0) goto LAB_001e75e7;
    if (iVar26 < 0x44) {
      pPStack_108 = (Package *)0x1e75d6;
      memcpy(pPVar23,pcVar16,(size_t)__n_01);
      (&__n_01->inIsBigEndian)[(long)pPVar23->inPkgName] = 0;
      return;
    }
  }
  pPStack_108 = (Package *)readFile;
  path = pcVar16;
  extractPackageName();
  pPStack_130 = pPVar23;
  sStack_128 = sVar17;
  pUStack_120 = pUVar25;
  pcStack_118 = pcVar16;
  pUStack_110 = __n_01;
  pPStack_108 = this;
  makeFullFilename(path,pcVar15,acStack_538,(int32_t)pUVar20);
  __stream = fopen(acStack_538,"rb");
  if (__stream == (FILE *)0x0) {
    readFile();
LAB_001e7730:
    readFile();
LAB_001e773d:
    readFile();
  }
  else {
    fseek(__stream,0,2);
    lVar22 = ftell(__stream);
    fseek(__stream,0,0);
    iVar26 = ferror(__stream);
    uVar21 = (uint)lVar22;
    if (((int)uVar21 < 1) || (iVar26 != 0)) goto LAB_001e7730;
    uVar19 = uVar21 + 0xf & 0x7ffffff0;
    *extraout_RDX = uVar19;
    puVar13 = (uint8_t *)uprv_malloc_63((ulong)uVar19);
    if (puVar13 == (uint8_t *)0x0) goto LAB_001e773d;
    sVar17 = fread(puVar13,1,(ulong)(uVar21 & 0x7fffffff),__stream);
    if (uVar21 == (uint)sVar17) {
      iVar26 = *extraout_RDX - uVar21;
      if (iVar26 != 0 && (int)uVar21 <= (int)*extraout_RDX) {
        memset(puVar13 + (uVar21 & 0x7fffffff),0xaa,(long)iVar26);
      }
      fclose(__stream);
      UStack_53c = U_ZERO_ERROR;
      uVar21 = getTypeEnumForInputData(puVar13,*extraout_RDX,&UStack_53c);
      if ((-1 < (int)uVar21) && (UStack_53c < U_ILLEGAL_ARGUMENT_ERROR)) {
        pUVar20->inIsBigEndian = "lb?e"[uVar21];
        uprv_free_63((void *)0x0);
        return;
      }
      goto LAB_001e7755;
    }
  }
  readFile();
LAB_001e7755:
  readFile();
  __clang_call_terminate(extraout_RAX);
}

Assistant:

void
Package::readPackage(const char *filename) {
    UDataSwapper *ds;
    const UDataInfo *pInfo;
    UErrorCode errorCode;

    const uint8_t *inBytes;

    int32_t length, offset, i;
    int32_t itemLength, typeEnum;
    char type;

    const UDataOffsetTOCEntry *inEntries;

    extractPackageName(filename, inPkgName, (int32_t)sizeof(inPkgName));

    /* read the file */
    inData=readFile(NULL, filename, inLength, type);
    length=inLength;

    /*
     * swap the header - even if the swapping itself is a no-op
     * because it tells us the header length
     */
    errorCode=U_ZERO_ERROR;
    makeTypeProps(type, inCharset, inIsBigEndian);
    ds=udata_openSwapper(inIsBigEndian, inCharset, U_IS_BIG_ENDIAN, U_CHARSET_FAMILY, &errorCode);
    if(U_FAILURE(errorCode)) {
        fprintf(stderr, "icupkg: udata_openSwapper(\"%s\") failed - %s\n",
                filename, u_errorName(errorCode));
        exit(errorCode);
    }

    ds->printError=printPackageError;
    ds->printErrorContext=stderr;

    headerLength=sizeof(header);
    if(length<headerLength) {
        headerLength=length;
    }
    headerLength=udata_swapDataHeader(ds, inData, headerLength, header, &errorCode);
    if(U_FAILURE(errorCode)) {
        exit(errorCode);
    }

    /* check data format and format version */
    pInfo=(const UDataInfo *)((const char *)inData+4);
    if(!(
        pInfo->dataFormat[0]==0x43 &&   /* dataFormat="CmnD" */
        pInfo->dataFormat[1]==0x6d &&
        pInfo->dataFormat[2]==0x6e &&
        pInfo->dataFormat[3]==0x44 &&
        pInfo->formatVersion[0]==1
    )) {
        fprintf(stderr, "icupkg: data format %02x.%02x.%02x.%02x (format version %02x) is not recognized as an ICU .dat package\n",
                pInfo->dataFormat[0], pInfo->dataFormat[1],
                pInfo->dataFormat[2], pInfo->dataFormat[3],
                pInfo->formatVersion[0]);
        exit(U_UNSUPPORTED_ERROR);
    }
    inIsBigEndian=(UBool)pInfo->isBigEndian;
    inCharset=pInfo->charsetFamily;

    inBytes=(const uint8_t *)inData+headerLength;
    inEntries=(const UDataOffsetTOCEntry *)(inBytes+4);

    /* check that the itemCount fits, then the ToC table, then at least the header of the last item */
    length-=headerLength;
    if(length<4) {
        /* itemCount does not fit */
        offset=0x7fffffff;
    } else {
        itemCount=udata_readInt32(ds, *(const int32_t *)inBytes);
        setItemCapacity(itemCount); /* resize so there's space */
        if(itemCount==0) {
            offset=4;
        } else if(length<(4+8*itemCount)) {
            /* ToC table does not fit */
            offset=0x7fffffff;
        } else {
            /* offset of the last item plus at least 20 bytes for its header */
            offset=20+(int32_t)ds->readUInt32(inEntries[itemCount-1].dataOffset);
        }
    }
    if(length<offset) {
        fprintf(stderr, "icupkg: too few bytes (%ld after header) for a .dat package\n",
                        (long)length);
        exit(U_INDEX_OUTOFBOUNDS_ERROR);
    }
    /* do not modify the package length variable until the last item's length is set */

    if(itemCount<=0) {
        if(doAutoPrefix) {
            fprintf(stderr, "icupkg: --auto_toc_prefix[_with_type] but the input package is empty\n");
            exit(U_INVALID_FORMAT_ERROR);
        }
    } else {
        char prefix[MAX_PKG_NAME_LENGTH+4];
        char *s, *inItemStrings;

        if(itemCount>itemMax) {
            fprintf(stderr, "icupkg: too many items, maximum is %d\n", itemMax);
            exit(U_BUFFER_OVERFLOW_ERROR);
        }

        /* swap the item name strings */
        int32_t stringsOffset=4+8*itemCount;
        itemLength=(int32_t)(ds->readUInt32(inEntries[0].dataOffset))-stringsOffset;

        // don't include padding bytes at the end of the item names
        while(itemLength>0 && inBytes[stringsOffset+itemLength-1]!=0) {
            --itemLength;
        }

        if((inStringTop+itemLength)>STRING_STORE_SIZE) {
            fprintf(stderr, "icupkg: total length of item name strings too long\n");
            exit(U_BUFFER_OVERFLOW_ERROR);
        }

        inItemStrings=inStrings+inStringTop;
        ds->swapInvChars(ds, inBytes+stringsOffset, itemLength, inItemStrings, &errorCode);
        if(U_FAILURE(errorCode)) {
            fprintf(stderr, "icupkg failed to swap the input .dat package item name strings\n");
            exit(U_INVALID_FORMAT_ERROR);
        }
        inStringTop+=itemLength;

        // reset the Item entries
        memset(items, 0, itemCount*sizeof(Item));

        /*
         * Get the common prefix of the items.
         * New-style ICU .dat packages use tree separators ('/') between package names,
         * tree names, and item names,
         * while old-style ICU .dat packages (before multi-tree support)
         * use an underscore ('_') between package and item names.
         */
        offset=(int32_t)ds->readUInt32(inEntries[0].nameOffset)-stringsOffset;
        s=inItemStrings+offset;  // name of the first entry
        int32_t prefixLength;
        if(doAutoPrefix) {
            // Use the first entry's prefix. Must be a new-style package.
            const char *prefixLimit=strchr(s, U_TREE_ENTRY_SEP_CHAR);
            if(prefixLimit==NULL) {
                fprintf(stderr,
                        "icupkg: --auto_toc_prefix[_with_type] but "
                        "the first entry \"%s\" does not contain a '%c'\n",
                        s, U_TREE_ENTRY_SEP_CHAR);
                exit(U_INVALID_FORMAT_ERROR);
            }
            prefixLength=(int32_t)(prefixLimit-s);
            if(prefixLength==0 || prefixLength>=UPRV_LENGTHOF(pkgPrefix)) {
                fprintf(stderr,
                        "icupkg: --auto_toc_prefix[_with_type] but "
                        "the prefix of the first entry \"%s\" is empty or too long\n",
                        s);
                exit(U_INVALID_FORMAT_ERROR);
            }
            if(prefixEndsWithType && s[prefixLength-1]!=type) {
                fprintf(stderr,
                        "icupkg: --auto_toc_prefix_with_type but "
                        "the prefix of the first entry \"%s\" does not end with '%c'\n",
                        s, type);
                exit(U_INVALID_FORMAT_ERROR);
            }
            memcpy(pkgPrefix, s, prefixLength);
            pkgPrefix[prefixLength]=0;
            memcpy(prefix, s, ++prefixLength);  // include the /
        } else {
            // Use the package basename as prefix.
            int32_t inPkgNameLength= static_cast<int32_t>(strlen(inPkgName));
            memcpy(prefix, inPkgName, inPkgNameLength);
            prefixLength=inPkgNameLength;

            if( (int32_t)strlen(s)>=(inPkgNameLength+2) &&
                0==memcmp(s, inPkgName, inPkgNameLength) &&
                s[inPkgNameLength]=='_'
            ) {
                // old-style .dat package
                prefix[prefixLength++]='_';
            } else {
                // new-style .dat package
                prefix[prefixLength++]=U_TREE_ENTRY_SEP_CHAR;
                // if it turns out to not contain U_TREE_ENTRY_SEP_CHAR
                // then the test in the loop below will fail
            }
        }
        prefix[prefixLength]=0;

        /* read the ToC table */
        for(i=0; i<itemCount; ++i) {
            // skip the package part of the item name, error if it does not match the actual package name
            // or if nothing follows the package name
            offset=(int32_t)ds->readUInt32(inEntries[i].nameOffset)-stringsOffset;
            s=inItemStrings+offset;
            if(0!=strncmp(s, prefix, prefixLength) || s[prefixLength]==0) {
                fprintf(stderr, "icupkg: input .dat item name \"%s\" does not start with \"%s\"\n",
                        s, prefix);
                exit(U_INVALID_FORMAT_ERROR);
            }
            items[i].name=s+prefixLength;

            // set the item's data
            items[i].data=(uint8_t *)inBytes+ds->readUInt32(inEntries[i].dataOffset);
            if(i>0) {
                items[i-1].length=(int32_t)(items[i].data-items[i-1].data);

                // set the previous item's platform type
                typeEnum=getTypeEnumForInputData(items[i-1].data, items[i-1].length, &errorCode);
                if(typeEnum<0 || U_FAILURE(errorCode)) {
                    fprintf(stderr, "icupkg: not an ICU data file: item \"%s\" in \"%s\"\n", items[i-1].name, filename);
                    exit(U_INVALID_FORMAT_ERROR);
                }
                items[i-1].type=makeTypeLetter(typeEnum);
            }
            items[i].isDataOwned=FALSE;
        }
        // set the last item's length
        items[itemCount-1].length=length-ds->readUInt32(inEntries[itemCount-1].dataOffset);

        // set the last item's platform type
        typeEnum=getTypeEnumForInputData(items[itemCount-1].data, items[itemCount-1].length, &errorCode);
        if(typeEnum<0 || U_FAILURE(errorCode)) {
            fprintf(stderr, "icupkg: not an ICU data file: item \"%s\" in \"%s\"\n", items[itemCount-1].name, filename);
            exit(U_INVALID_FORMAT_ERROR);
        }
        items[itemCount-1].type=makeTypeLetter(typeEnum);

        if(type!=U_ICUDATA_TYPE_LETTER[0]) {
            // sort the item names for the local charset
            sortItems();
        }
    }

    udata_closeSwapper(ds);
}